

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDataIndex.cpp
# Opt level: O1

bool __thiscall
MinVR::VRDataIndex::linkNode
          (VRDataIndex *this,string *fullSourceName,string *fullTargetName,int depthLimit)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char *pcVar3;
  _List_node_base *p_Var4;
  pointer pcVar5;
  VRDatum_conflict *pVVar6;
  int iVar7;
  iterator iVar8;
  const_iterator cVar9;
  mapped_type *pmVar10;
  undefined4 extraout_var;
  long *plVar11;
  VRError *pVVar12;
  size_type *psVar13;
  _Self __tmp;
  _Alloc_hider _Var14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string fixTargetName;
  VRDatumPtr sourceNode;
  VRContainer childrenToCopy;
  string local_1c8;
  string local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  int local_164;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>
  local_140;
  VRDatumPtr local_110;
  int local_fc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  string *local_d8;
  key_type local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_164 = depthLimit;
  if (7 < depthLimit) {
    pVVar12 = (VRError *)__cxa_allocate_exception(0xa8);
    local_140.first._M_dataplus._M_p = (pointer)&local_140.first.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"Too deep a recursion.","")
    ;
    local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_188,"Did you set up a circular reference?","");
    local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1c8,
               "/workspace/llm4binary/github/license_c_cmakelists/MinVR[P]MinVR/src/config/VRDataIndex.cpp"
               ,"");
    local_160._M_dataplus._M_p._0_4_ = 0x503;
    local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1a8,
               "bool MinVR::VRDataIndex::linkNode(const std::string &, const std::string &, int)",""
              );
    VRError::VRError(pVVar12,&local_140.first,&local_188,&local_1c8,(int *)&local_160,&local_1a8);
    __cxa_throw(pVVar12,&VRError::typeinfo,VRError::~VRError);
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  iVar8 = _getEntry(this,fullSourceName,&local_70,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  p_Var1 = &(this->_theIndex)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)iVar8._M_node != p_Var1) {
    pcVar3 = (fullTargetName->_M_dataplus)._M_p;
    if (*pcVar3 == '/') {
      local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_188,pcVar3,pcVar3 + fullTargetName->_M_string_length);
    }
    else {
      std::operator+(&local_188,"/",fullTargetName);
    }
    local_110.pData = *(VRDatum_conflict **)(iVar8._M_node + 2);
    local_110.reference = (VRDatumPtrRC *)iVar8._M_node[2]._M_parent;
    ((_Base_ptr)local_110.reference)->_M_color =
         ((_Base_ptr)local_110.reference)->_M_color + _S_black;
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"");
    iVar8 = _getEntry(this,&local_188,&local_b0,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if ((_Rb_tree_header *)iVar8._M_node == p_Var1) {
      paVar2 = &local_140.first.field_2;
      local_140.first._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_140,local_188._M_dataplus._M_p,
                 local_188._M_dataplus._M_p + local_188._M_string_length);
      local_140.second.pData = local_110.pData;
      local_140.second.reference = local_110.reference;
      (local_110.reference)->count = (local_110.reference)->count + _S_black;
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,MinVR::VRDatumPtr>,std::_Select1st<std::pair<std::__cxx11::string_const,MinVR::VRDatumPtr>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,MinVR::VRDatumPtr>>>
      ::_M_insert_unique<std::pair<std::__cxx11::string_const,MinVR::VRDatumPtr>>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,MinVR::VRDatumPtr>,std::_Select1st<std::pair<std::__cxx11::string_const,MinVR::VRDatumPtr>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,MinVR::VRDatumPtr>>>
                  *)this,&local_140);
      VRDatumPtr::~VRDatumPtr(&local_140.second);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140.first._M_dataplus._M_p != paVar2) {
        operator_delete(local_140.first._M_dataplus._M_p,
                        local_140.first.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      VRDatumPtr::operator=((VRDatumPtr *)(iVar8._M_node + 2),&local_110);
    }
    pVVar6 = local_110.pData;
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"linkContent","");
    p_Var4 = (pVVar6->attrList).
             super__List_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
             ._M_impl._M_node.super__List_node_base._M_next;
    cVar9 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)(p_Var4 + 1),&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    if (cVar9._M_node == (_Base_ptr)&p_Var4[1]._M_prev) {
      pmVar10 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&this->_linkRegister,fullSourceName);
      std::__cxx11::string::_M_assign((string *)pmVar10);
      if ((local_110.pData)->type == VRCORETYPE_CONTAINER) {
        iVar7 = (*(local_110.pData)->_vptr_VRDatum[3])();
        (**(code **)(*(long *)CONCAT44(extraout_var,iVar7) + 0x88))
                  (&local_f8,(long *)CONCAT44(extraout_var,iVar7));
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            local_f8._M_dataplus._M_p != &local_f8) {
          local_164 = local_164 + 1;
          _Var14._M_p = local_f8._M_dataplus._M_p;
          local_d8 = fullSourceName;
          do {
            local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
            pcVar5 = (local_d8->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_1c8,pcVar5,pcVar5 + local_d8->_M_string_length);
            std::__cxx11::string::append((char *)&local_1c8);
            plVar11 = (long *)std::__cxx11::string::_M_append
                                        ((char *)&local_1c8,
                                         (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)_Var14._M_p)->field_2)._M_allocated_capacity);
            local_140.first._M_dataplus._M_p = (pointer)&local_140.first.field_2;
            psVar13 = (size_type *)(plVar11 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar11 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar13) {
              local_140.first.field_2._M_allocated_capacity = *psVar13;
              local_140.first.field_2._8_4_ = (undefined4)plVar11[3];
              local_140.first.field_2._12_4_ = *(undefined4 *)((long)plVar11 + 0x1c);
            }
            else {
              local_140.first.field_2._M_allocated_capacity = *psVar13;
              local_140.first._M_dataplus._M_p = (pointer)*plVar11;
            }
            local_140.first._M_string_length = plVar11[1];
            *plVar11 = (long)psVar13;
            plVar11[1] = 0;
            *(undefined1 *)(plVar11 + 2) = 0;
            local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_160,local_188._M_dataplus._M_p,
                       local_188._M_dataplus._M_p + local_188._M_string_length);
            std::__cxx11::string::append((char *)&local_160);
            plVar11 = (long *)std::__cxx11::string::_M_append
                                        ((char *)&local_160,
                                         (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)_Var14._M_p)->field_2)._M_allocated_capacity);
            psVar13 = (size_type *)(plVar11 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar11 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar13) {
              local_1a8.field_2._M_allocated_capacity = *psVar13;
              local_1a8.field_2._8_8_ = plVar11[3];
              local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
            }
            else {
              local_1a8.field_2._M_allocated_capacity = *psVar13;
              local_1a8._M_dataplus._M_p = (pointer)*plVar11;
            }
            local_1a8._M_string_length = plVar11[1];
            *plVar11 = (long)psVar13;
            plVar11[1] = 0;
            *(undefined1 *)(plVar11 + 2) = 0;
            linkNode(this,&local_140.first,&local_1a8,local_164);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
              operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_160._M_dataplus._M_p != &local_160.field_2) {
              operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_140.first._M_dataplus._M_p != &local_140.first.field_2) {
              operator_delete(local_140.first._M_dataplus._M_p,
                              local_140.first.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
              operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1
                             );
            }
            _Var14._M_p = (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           _Var14._M_p)->_M_dataplus)._M_p;
          } while ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Var14._M_p
                   != &local_f8);
        }
        std::__cxx11::
        _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_clear((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_f8);
      }
      VRDatumPtr::~VRDatumPtr(&local_110);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p != &local_188.field_2) {
        operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
      }
      return true;
    }
    pVVar12 = (VRError *)__cxa_allocate_exception(0xa8);
    local_140.first._M_dataplus._M_p = (pointer)&local_140.first.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_140,"Linking content and nodes not allowed.","");
    std::operator+(&local_f8,
                   "You really don\'t want to mix linkContent and linkNode, as in linking ",
                   fullSourceName);
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_f8);
    local_160._M_dataplus._M_p = (pointer)*plVar11;
    psVar13 = (size_type *)(plVar11 + 2);
    if ((size_type *)local_160._M_dataplus._M_p == psVar13) {
      local_160.field_2._M_allocated_capacity = *psVar13;
      local_160.field_2._8_8_ = plVar11[3];
      local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
    }
    else {
      local_160.field_2._M_allocated_capacity = *psVar13;
    }
    local_160._M_string_length = plVar11[1];
    *plVar11 = (long)psVar13;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    std::operator+(&local_1a8,&local_160,&local_188);
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_1a8);
    local_1c8._M_dataplus._M_p = (pointer)*plVar11;
    psVar13 = (size_type *)(plVar11 + 2);
    if ((size_type *)local_1c8._M_dataplus._M_p == psVar13) {
      local_1c8.field_2._M_allocated_capacity = *psVar13;
      local_1c8.field_2._8_4_ = (undefined4)plVar11[3];
      local_1c8.field_2._12_4_ = *(undefined4 *)((long)plVar11 + 0x1c);
      local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
    }
    else {
      local_1c8.field_2._M_allocated_capacity = *psVar13;
    }
    local_1c8._M_string_length = plVar11[1];
    *plVar11 = (long)psVar13;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,
               "/workspace/llm4binary/github/license_c_cmakelists/MinVR[P]MinVR/src/config/VRDataIndex.cpp"
               ,"");
    local_fc = 0x522;
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,
               "bool MinVR::VRDataIndex::linkNode(const std::string &, const std::string &, int)",""
              );
    VRError::VRError(pVVar12,&local_140.first,&local_1c8,&local_50,&local_fc,&local_90);
    __cxa_throw(pVVar12,&VRError::typeinfo,VRError::~VRError);
  }
  pVVar12 = (VRError *)__cxa_allocate_exception(0xa8);
  std::operator+(&local_140.first,"Can\'t find the source node: ",fullSourceName);
  local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"");
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1c8,
             "/workspace/llm4binary/github/license_c_cmakelists/MinVR[P]MinVR/src/config/VRDataIndex.cpp"
             ,"");
  local_160._M_dataplus._M_p._0_4_ = 0x508;
  local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1a8,
             "bool MinVR::VRDataIndex::linkNode(const std::string &, const std::string &, int)","");
  VRError::VRError(pVVar12,&local_140.first,&local_188,&local_1c8,(int *)&local_160,&local_1a8);
  __cxa_throw(pVVar12,&VRError::typeinfo,VRError::~VRError);
}

Assistant:

bool VRDataIndex::linkNode(const std::string &fullSourceName,
                           const std::string &fullTargetName,
                           int depthLimit) {

  // This is an easy way to make a disaster, so we have a recursion
  // limit.  It's possible this should be adjustable, but not sure of
  // a use case where the plausible depthLimit would exceed 10.
  if (depthLimit > 7)
    VRERROR("Too deep a recursion.", "Did you set up a circular reference?");

  // Find source node, fail if it does not exist.
  VRDataMap::iterator sourceEntry = _getEntry(fullSourceName);
  if (sourceEntry == _theIndex.end())
    VRERRORNOADV("Can't find the source node: " + fullSourceName);

  // It's possible the target name won't start with a '/', in which
  // case, stick one on front.
  std::string fixTargetName =
    (fullTargetName[0] == '/') ? fullTargetName : "/" + fullTargetName;

  
  VRDatumPtr sourceNode = sourceEntry->second;
  VRDataMap::iterator targetEntry = _getEntry(fixTargetName);

  // Does this name already exist?
  if (targetEntry != _theIndex.end()) {

    // Yes.  Make the copy.
    targetEntry->second = sourceNode;
  } else {

    // No. Make an entry in the index, linked to the sourceNode.
    _theIndex.insert(VRDataMap::value_type(fixTargetName, sourceNode));

  }

  if (sourceNode->hasAttribute("linkContent"))
    VRERROR("Linking content and nodes not allowed.",
            "You really don't want to mix linkContent and linkNode, as in linking " +
            fullSourceName + " and " + fixTargetName + ".");

  // Record the link we made.  This is for use by the copy constructor.
  _linkRegister[fullSourceName] = fixTargetName;

  // If this is a container, recurse into the children, and copy them, too.
  if (sourceNode->getType() == VRCORETYPE_CONTAINER) {

    VRContainer childrenToCopy = sourceNode->getValue();

    // If there are no children, go home.
    if (childrenToCopy.empty()) return true;

    // Otherwise copy them, too.
    for (VRContainer::iterator jt = childrenToCopy.begin();
         jt != childrenToCopy.end(); jt++)
      linkNode(fullSourceName + "/" + *jt,
               fixTargetName + "/" + *jt,
               depthLimit + 1);
  }
  return true;
}